

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O0

SNMP_PACKET_PARSE_ERROR __thiscall
SNMPPacket::parsePacket(SNMPPacket *this,ComplexType *structure,SNMPParsingState state)

{
  bool bVar1;
  SNMP_PACKET_PARSE_ERROR SVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  ComplexType *pCVar6;
  element_type *peVar7;
  element_type *peVar8;
  size_type sVar9;
  reference pvVar10;
  shared_ptr<BER_CONTAINER> local_c0;
  undefined1 local_b0 [8];
  value_type vbValue;
  value_type vbOid;
  undefined1 local_88 [8];
  shared_ptr<ComplexType> varbindValues;
  shared_ptr<BER_CONTAINER> local_68;
  shared_ptr<BER_CONTAINER> local_58;
  __shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr<BER_CONTAINER> *value;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_> *__range1
  ;
  SNMPParsingState state_local;
  ComplexType *structure_local;
  SNMPPacket *this_local;
  
  __end1 = std::
           vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
           ::begin(&structure->values);
  value = (shared_ptr<BER_CONTAINER> *)
          std::
          vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>::
          end(&structure->values);
  __range1._4_4_ = state;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<BER_CONTAINER>_*,_std::vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>_>
                                *)&value);
    if ((!bVar1) ||
       (local_48 = &__gnu_cxx::
                    __normal_iterator<std::shared_ptr<BER_CONTAINER>_*,_std::vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>_>
                    ::operator*(&__end1)->
                    super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>,
       __range1._4_4_ == DONE)) {
      return 1;
    }
    switch(__range1._4_4_) {
    case SNMPVERSION:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
      if ((!bVar1) ||
         (peVar7 = std::__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48), peVar7->_type != INTEGER)) {
        return -0x1e;
      }
      std::static_pointer_cast<IntegerType,BER_CONTAINER>(&local_58);
      std::shared_ptr<IntegerType>::operator=
                (&this->snmpVersionPtr,(shared_ptr<IntegerType> *)&local_58);
      std::shared_ptr<IntegerType>::~shared_ptr((shared_ptr<IntegerType> *)&local_58);
      peVar4 = std::__shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->snmpVersionPtr).
                           super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>);
      this->snmpVersion = peVar4->_value;
      if (1 < (int)this->snmpVersion) {
        return -0x1e;
      }
      __range1._4_4_ = COMMUNITY;
      break;
    case COMMUNITY:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
      if ((!bVar1) ||
         (peVar7 = std::__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48), peVar7->_type != STRING)) {
        return -0x1f;
      }
      std::static_pointer_cast<OctetType,BER_CONTAINER>(&local_68);
      std::shared_ptr<OctetType>::operator=
                (&this->communityStringPtr,(shared_ptr<OctetType> *)&local_68);
      std::shared_ptr<OctetType>::~shared_ptr((shared_ptr<OctetType> *)&local_68);
      peVar3 = std::__shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->communityStringPtr).
                           super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>);
      std::__cxx11::string::operator=((string *)&this->communityString,(string *)&peVar3->_value);
      __range1._4_4_ = PDU;
      break;
    case PDU:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
      if (((bVar1) &&
          (peVar7 = std::
                    __shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_48), 0x9f < (int)peVar7->_type)) &&
         (peVar7 = std::__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48), (int)peVar7->_type < 0xa8)) {
        peVar7 = std::__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        this->packetPDUType = peVar7->_type;
        pCVar6 = (ComplexType *)
                 std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::get(local_48);
        SVar2 = parsePacket(this,pCVar6,REQUESTID);
        return SVar2;
      }
      return -0x15;
    case REQUESTID:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
      if ((!bVar1) ||
         (peVar7 = std::__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48), peVar7->_type != INTEGER)) {
        return -0x21;
      }
      std::static_pointer_cast<IntegerType,BER_CONTAINER>
                ((shared_ptr<BER_CONTAINER> *)
                 &varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<IntegerType>::operator=
                (&this->requestIDPtr,
                 (shared_ptr<IntegerType> *)
                 &varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<IntegerType>::~shared_ptr
                ((shared_ptr<IntegerType> *)
                 &varbindValues.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      peVar4 = std::__shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->requestIDPtr).
                           super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>);
      this->requestID = (long)peVar4->_value;
      __range1._4_4_ = ERRORSTATUS;
      break;
    case ERRORSTATUS:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
      if ((!bVar1) ||
         (peVar7 = std::__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48), peVar7->_type != INTEGER)) {
        return -0x22;
      }
      peVar5 = std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::get(local_48);
      this->errorStatus = *(ErrorStatus *)(peVar5 + 1);
      __range1._4_4_ = ERRORID;
      break;
    case ERRORID:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
      if ((!bVar1) ||
         (peVar7 = std::__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48), peVar7->_type != INTEGER)) {
        return -0x23;
      }
      peVar5 = std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::get(local_48);
      this->errorIndex = *(ErrorIndex *)(peVar5 + 1);
      __range1._4_4_ = VARBINDS;
      break;
    case VARBINDS:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
      if ((bVar1) &&
         (peVar7 = std::__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48), peVar7->_type == STRUCTURE)) {
        pCVar6 = (ComplexType *)
                 std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::get(local_48);
        SVar2 = parsePacket(this,pCVar6,VARBIND);
        return SVar2;
      }
      return -0x24;
    case VARBIND:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
      if ((!bVar1) ||
         (peVar7 = std::__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48), peVar7->_type != STRUCTURE)) {
        return -0x25;
      }
      std::static_pointer_cast<ComplexType,BER_CONTAINER>((shared_ptr<BER_CONTAINER> *)local_88);
      peVar8 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      sVar9 = std::
              vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
              ::size(&peVar8->values);
      if (sVar9 == 2) {
        peVar8 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_88);
        pvVar10 = std::
                  vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                  ::operator[](&peVar8->values,0);
        std::shared_ptr<BER_CONTAINER>::shared_ptr
                  ((shared_ptr<BER_CONTAINER> *)
                   &vbValue.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,pvVar10);
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &vbValue.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if ((bVar1) &&
           (peVar7 = std::
                     __shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&vbValue.
                                    super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount), peVar7->_type == OID)) {
          peVar8 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
          pvVar10 = std::
                    vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                    ::operator[](&peVar8->values,1);
          std::shared_ptr<BER_CONTAINER>::shared_ptr((shared_ptr<BER_CONTAINER> *)local_b0,pvVar10);
          std::static_pointer_cast<OIDType,BER_CONTAINER>(&local_c0);
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<std::shared_ptr<OIDType>,std::shared_ptr<BER_CONTAINER>&>
                    ((deque<VarBind,std::allocator<VarBind>> *)&this->varbindList,
                     (shared_ptr<OIDType> *)&local_c0,(shared_ptr<BER_CONTAINER> *)local_b0);
          std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)&local_c0);
          std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_b0);
          bVar1 = false;
        }
        else {
          this_local._4_4_ = -0x15;
          bVar1 = true;
        }
        std::shared_ptr<BER_CONTAINER>::~shared_ptr
                  ((shared_ptr<BER_CONTAINER> *)
                   &vbValue.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        this_local._4_4_ = -0x25;
        bVar1 = true;
      }
      std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_88);
      if (bVar1) {
        return this_local._4_4_;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<BER_CONTAINER>_*,_std::vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

SNMP_PACKET_PARSE_ERROR SNMPPacket::parsePacket(ComplexType *structure, enum SNMPParsingState state) {
    for(const auto& value : structure->values){
        if(state == DONE) break;

        switch(state) {

            case SNMPVERSION:
                ASSERT_ASN_STATE_TYPE(value, SNMPVERSION);
                this->snmpVersionPtr = std::static_pointer_cast<IntegerType>(value);
                this->snmpVersion = (SNMP_VERSION) this->snmpVersionPtr.get()->_value;
                if (this->snmpVersion >= SNMP_VERSION_MAX) {
                    SNMP_LOGW("Invalid SNMP Version: %d\n", this->snmpVersion);
                    return SNMP_PARSE_ERROR_AT_STATE(SNMPVERSION);
                };
                state = COMMUNITY;
            break;

            case COMMUNITY:
                ASSERT_ASN_STATE_TYPE(value, COMMUNITY);
                this->communityStringPtr = std::static_pointer_cast<OctetType>(value);
                this->communityString = this->communityStringPtr.get()->_value;
                state = PDU;
            break;

            case PDU:
                ASSERT_ASN_PARSING_TYPE_RANGE(value, ASN_PDU_TYPE_MIN_VALUE, ASN_PDU_TYPE_MAX_VALUE)
                this->packetPDUType = value->_type;
                return this->parsePacket(static_cast<ComplexType*>(value.get()), REQUESTID);

            case REQUESTID:
                ASSERT_ASN_STATE_TYPE(value, REQUESTID);
                this->requestIDPtr = std::static_pointer_cast<IntegerType>(value);
                this->requestID = this->requestIDPtr.get()->_value;
                state = ERRORSTATUS;
            break;

            case ERRORSTATUS:
                ASSERT_ASN_STATE_TYPE(value, ERRORSTATUS);
                this->errorStatus.errorStatus = (SNMP_ERROR_STATUS) static_cast<IntegerType *>(value.get())->_value;
                state = ERRORID;
            break;

            case ERRORID:
                ASSERT_ASN_STATE_TYPE(value, ERRORID);
                this->errorIndex.errorIndex = static_cast<IntegerType*>(value.get())->_value;
                state = VARBINDS;
            break;

            case VARBINDS:
                ASSERT_ASN_STATE_TYPE(value, VARBINDS);
                // we have a varbind structure, lets dive into it.
                return this->parsePacket(static_cast<ComplexType*>(value.get()), VARBIND);

            case VARBIND:
            {
                ASSERT_ASN_STATE_TYPE(value, VARBIND);
                // we are in a single varbind

                auto varbindValues = std::static_pointer_cast<ComplexType>(value);

                if (varbindValues->values.size() != 2) {
                    SNMP_LOGW("Expecting VARBIND TO CONTAIN 2 OBEJCTS; %lu\n",
                              varbindValues ? varbindValues->values.size() : 0);
                    return SNMP_PARSE_ERROR_AT_STATE(VARBIND);
                };

                auto vbOid = varbindValues->values[0];
                ASSERT_ASN_TYPE_AT_STATE(vbOid, OID, VARBIND);

                auto vbValue = varbindValues->values[1];
                this->varbindList.emplace_back(
                    std::static_pointer_cast<OIDType>(vbOid),
                    vbValue
                );
            }
            break;

            case DONE:
                return true;
        }
    }
    return SNMP_ERROR_OK;
}